

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonReturn(JsonNode *pNode,sqlite3_context *pCtx,sqlite3_value **aReplace)

{
  char cVar1;
  u32 uVar2;
  char *pcVar3;
  byte bVar4;
  u32 uVar5;
  u32 uVar6;
  long lVar7;
  size_t sVar8;
  u8 *z;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long val;
  Mem *pMVar14;
  code *xDel;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  double r;
  double local_38;
  
  switch(pNode->eType) {
  case '\x01':
    pMVar14 = pCtx->pOut;
    if ((pMVar14->flags & 0x9000) != 0) {
      val = 1;
LAB_001a1a33:
      vdbeReleaseAndSetInt64(pMVar14,val);
      return;
    }
    (pMVar14->u).r = 4.94065645841247e-324;
    break;
  case '\x02':
    pMVar14 = pCtx->pOut;
    if ((pMVar14->flags & 0x9000) != 0) {
      val = 0;
      goto LAB_001a1a33;
    }
    (pMVar14->u).r = 0.0;
    break;
  case '\x03':
    lVar7 = 0;
    pcVar3 = (pNode->u).zJContent + (*(pNode->u).zJContent == '-');
    do {
      cVar1 = *pcVar3;
      if (9 < (byte)(cVar1 - 0x30U)) {
        val = -lVar7;
        if (*(pNode->u).zJContent != '-') {
          val = lVar7;
        }
        pMVar14 = pCtx->pOut;
        if ((pMVar14->flags & 0x9000) != 0) goto LAB_001a1a33;
        (pMVar14->u).i = val;
        goto LAB_001a1a5f;
      }
      if (lVar7 < 0xccccccccccccccc) {
LAB_001a1678:
        lVar7 = (ulong)(byte)(cVar1 - 0x30) + lVar7 * 10;
        iVar10 = 0;
        bVar17 = true;
      }
      else {
        iVar9 = 5;
        iVar10 = 5;
        if (lVar7 == 0xccccccccccccccc) {
          iVar10 = iVar9;
          if ((9 < (byte)(pcVar3[1] - 0x30U)) && (cVar1 != '9')) {
            if (cVar1 != '8') goto LAB_001a1678;
            if (*(pNode->u).zJContent == '-') {
              pMVar14 = pCtx->pOut;
              if ((pMVar14->flags & 0x9000) == 0) {
                (pMVar14->u).r = -0.0;
                pMVar14->flags = 4;
              }
              else {
                vdbeReleaseAndSetInt64(pMVar14,-0x8000000000000000);
              }
              iVar10 = 6;
            }
          }
          bVar17 = false;
          lVar7 = 0xccccccccccccccc;
        }
        else {
          bVar17 = false;
        }
      }
      pcVar3 = pcVar3 + 1;
    } while (iVar10 == 0);
    if (iVar10 != 5) {
      if (iVar10 == 6) {
        return;
      }
      if (!bVar17) {
        return;
      }
    }
  case '\x04':
    pcVar3 = (pNode->u).zJContent;
    if (pcVar3 == (char *)0x0) {
      uVar11 = 0;
    }
    else {
      sVar8 = strlen(pcVar3);
      uVar11 = (uint)sVar8 & 0x3fffffff;
    }
    sqlite3AtoF(pcVar3,&local_38,uVar11,'\x01');
    sqlite3VdbeMemSetDouble(pCtx->pOut,local_38);
    return;
  case '\x05':
    if ((pNode->jnFlags & 2) == 0) {
      z = &((pNode->u).pPatch)->jnFlags;
      uVar11 = pNode->n - 2;
      xDel = (_func_void_void_ptr *)0xffffffffffffffff;
    }
    else {
      uVar2 = pNode->n;
      pcVar3 = (pNode->u).zJContent;
      z = (u8 *)sqlite3_malloc(uVar2 + 1);
      if (z == (u8 *)0x0) {
        sqlite3_result_error_nomem(pCtx);
        return;
      }
      uVar11 = 0;
      if (1 < uVar2 - 1) {
        uVar16 = 1;
        uVar11 = 0;
        do {
          uVar15 = (uint)uVar16;
          bVar4 = pcVar3[uVar16];
          bVar17 = true;
          uVar13 = uVar11;
          if (bVar4 == 0x5c) {
            uVar12 = uVar15 + 1;
            bVar4 = pcVar3[uVar12];
            uVar5 = (u32)bVar4;
            if (bVar4 < 0x6e) {
              uVar15 = 8;
              if (bVar4 != 0x62) {
                if (bVar4 != 0x66) {
LAB_001a1862:
                  if (bVar4 == 0x74) {
                    uVar5 = 9;
                  }
                  iVar10 = 1;
                  goto LAB_001a183d;
                }
                uVar15 = 0xc;
              }
LAB_001a1835:
              uVar5 = uVar15;
              iVar10 = 1;
              goto LAB_001a183d;
            }
            if (bVar4 == 0x6e) {
              uVar15 = 10;
              goto LAB_001a1835;
            }
            if (uVar5 == 0x72) {
              uVar15 = 0xd;
              goto LAB_001a1835;
            }
            if (uVar5 != 0x75) goto LAB_001a1862;
            uVar5 = jsonHexToInt4(pcVar3 + (ulong)uVar12 + 1);
            uVar12 = uVar15 + 5;
            bVar17 = uVar5 != 0;
            if (bVar17) {
              if (uVar5 < 0x80) {
                iVar10 = 1;
              }
              else if (uVar5 < 0x800) {
                z[uVar11] = (byte)(uVar5 >> 6) | 0xc0;
                uVar5 = (u32)((byte)uVar5 & 0x3f | 0x80);
                iVar10 = 2;
                uVar13 = uVar11 + 1;
              }
              else {
                if ((((uVar12 < uVar2 - 6) && ((uVar5 & 0xfc00) == 0xd800)) &&
                    (pcVar3[uVar15 + 6] == '\\')) &&
                   ((pcVar3[uVar15 + 7] == 'u' &&
                    (uVar6 = jsonHexToInt4(pcVar3 + (ulong)uVar12 + 3), (uVar6 & 0xfc00) == 0xdc00))
                   )) {
                  uVar12 = (uVar5 & 0x3ff) * 0x400;
                  uVar13 = (uVar6 & 0x3ff) + uVar12 + 0x10000;
                  z[uVar11] = (byte)(uVar13 >> 0x12) | 0xf0;
                  z[uVar11 + 1] = (byte)(uVar13 >> 0xc) & 0x3f | 0x80;
                  z[uVar11 + 2] = (byte)((uVar6 & 0x3ff | uVar12) >> 6) & 0x3f | 0x80;
                  bVar4 = (byte)uVar6 & 0x3f | 0x80;
                  iVar10 = 4;
                  uVar13 = uVar11 + 3;
                  uVar12 = uVar15 + 0xb;
                  goto LAB_001a1816;
                }
                z[uVar11] = (byte)(uVar5 >> 0xc) | 0xe0;
                z[uVar11 + 1] = (byte)(uVar5 >> 6) & 0x3f | 0x80;
                uVar5 = (u32)((byte)uVar5 & 0x3f | 0x80);
                iVar10 = 3;
                uVar13 = uVar11 + 2;
              }
              goto LAB_001a183d;
            }
          }
          else {
            iVar10 = 1;
            uVar12 = uVar15;
LAB_001a1816:
            uVar5 = (u32)bVar4;
LAB_001a183d:
            uVar11 = uVar11 + iVar10;
            z[uVar13] = (u8)uVar5;
          }
        } while ((bVar17) && (uVar16 = (ulong)(uVar12 + 1), uVar12 + 1 < uVar2 - 1));
      }
      z[uVar11] = '\0';
      xDel = sqlite3_free;
    }
    setResultStrOrError(pCtx,(char *)z,uVar11,'\x01',xDel);
    return;
  case '\x06':
  case '\a':
    jsonReturnJson(pNode,pCtx,(sqlite3_value **)0x0);
    return;
  default:
    pMVar14 = pCtx->pOut;
    if ((pMVar14->flags & 0x9000) == 0) {
      pMVar14->flags = 1;
      return;
    }
    vdbeMemClearExternAndSetNull(pMVar14);
    return;
  }
LAB_001a1a5f:
  pMVar14->flags = 4;
  return;
}

Assistant:

static void jsonReturn(
  JsonNode *pNode,            /* Node to return */
  sqlite3_context *pCtx,      /* Return value for this function */
  sqlite3_value **aReplace    /* Array of replacement values */
){
  switch( pNode->eType ){
    default: {
      assert( pNode->eType==JSON_NULL );
      sqlite3_result_null(pCtx);
      break;
    }
    case JSON_TRUE: {
      sqlite3_result_int(pCtx, 1);
      break;
    }
    case JSON_FALSE: {
      sqlite3_result_int(pCtx, 0);
      break;
    }
    case JSON_INT: {
      sqlite3_int64 i = 0;
      const char *z;
      assert( pNode->eU==1 );
      z = pNode->u.zJContent;
      if( z[0]=='-' ){ z++; }
      while( z[0]>='0' && z[0]<='9' ){
        unsigned v = *(z++) - '0';
        if( i>=LARGEST_INT64/10 ){
          if( i>LARGEST_INT64/10 ) goto int_as_real;
          if( z[0]>='0' && z[0]<='9' ) goto int_as_real;
          if( v==9 ) goto int_as_real;
          if( v==8 ){
            if( pNode->u.zJContent[0]=='-' ){
              sqlite3_result_int64(pCtx, SMALLEST_INT64);
              goto int_done;
            }else{
              goto int_as_real;
            }
          }
        }
        i = i*10 + v;
      }
      if( pNode->u.zJContent[0]=='-' ){ i = -i; }
      sqlite3_result_int64(pCtx, i);
      int_done:
      break;
      int_as_real: ; /* no break */ deliberate_fall_through
    }
    case JSON_REAL: {
      double r;
#ifdef SQLITE_AMALGAMATION
      const char *z;
      assert( pNode->eU==1 );
      z = pNode->u.zJContent;
      sqlite3AtoF(z, &r, sqlite3Strlen30(z), SQLITE_UTF8);
#else
      assert( pNode->eU==1 );
      r = strtod(pNode->u.zJContent, 0);
#endif
      sqlite3_result_double(pCtx, r);
      break;
    }
    case JSON_STRING: {
#if 0 /* Never happens because JNODE_RAW is only set by json_set(),
      ** json_insert() and json_replace() and those routines do not
      ** call jsonReturn() */
      if( pNode->jnFlags & JNODE_RAW ){
        assert( pNode->eU==1 );
        sqlite3_result_text(pCtx, pNode->u.zJContent, pNode->n,
                            SQLITE_TRANSIENT);
      }else
#endif
      assert( (pNode->jnFlags & JNODE_RAW)==0 );
      if( (pNode->jnFlags & JNODE_ESCAPE)==0 ){
        /* JSON formatted without any backslash-escapes */
        assert( pNode->eU==1 );
        sqlite3_result_text(pCtx, pNode->u.zJContent+1, pNode->n-2,
                            SQLITE_TRANSIENT);
      }else{
        /* Translate JSON formatted string into raw text */
        u32 i;
        u32 n = pNode->n;
        const char *z;
        char *zOut;
        u32 j;
        assert( pNode->eU==1 );
        z = pNode->u.zJContent;
        zOut = sqlite3_malloc( n+1 );
        if( zOut==0 ){
          sqlite3_result_error_nomem(pCtx);
          break;
        }
        for(i=1, j=0; i<n-1; i++){
          char c = z[i];
          if( c!='\\' ){
            zOut[j++] = c;
          }else{
            c = z[++i];
            if( c=='u' ){
              u32 v = jsonHexToInt4(z+i+1);
              i += 4;
              if( v==0 ) break;
              if( v<=0x7f ){
                zOut[j++] = (char)v;
              }else if( v<=0x7ff ){
                zOut[j++] = (char)(0xc0 | (v>>6));
                zOut[j++] = 0x80 | (v&0x3f);
              }else{
                u32 vlo;
                if( (v&0xfc00)==0xd800
                  && i<n-6
                  && z[i+1]=='\\'
                  && z[i+2]=='u'
                  && ((vlo = jsonHexToInt4(z+i+3))&0xfc00)==0xdc00
                ){
                  /* We have a surrogate pair */
                  v = ((v&0x3ff)<<10) + (vlo&0x3ff) + 0x10000;
                  i += 6;
                  zOut[j++] = 0xf0 | (v>>18);
                  zOut[j++] = 0x80 | ((v>>12)&0x3f);
                  zOut[j++] = 0x80 | ((v>>6)&0x3f);
                  zOut[j++] = 0x80 | (v&0x3f);
                }else{
                  zOut[j++] = 0xe0 | (v>>12);
                  zOut[j++] = 0x80 | ((v>>6)&0x3f);
                  zOut[j++] = 0x80 | (v&0x3f);
                }
              }
            }else{
              if( c=='b' ){
                c = '\b';
              }else if( c=='f' ){
                c = '\f';
              }else if( c=='n' ){
                c = '\n';
              }else if( c=='r' ){
                c = '\r';
              }else if( c=='t' ){
                c = '\t';
              }
              zOut[j++] = c;
            }
          }
        }
        zOut[j] = 0;
        sqlite3_result_text(pCtx, zOut, j, sqlite3_free);
      }
      break;
    }
    case JSON_ARRAY:
    case JSON_OBJECT: {
      jsonReturnJson(pNode, pCtx, aReplace);
      break;
    }
  }
}